

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DeleteFrom(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  u8 uVar1;
  uint p1;
  sqlite3 *db;
  Schema *pSVar2;
  long lVar3;
  u8 uVar4;
  u16 nPk;
  int iVar5;
  int iVar6;
  int iVar7;
  uint p2;
  int addr;
  Table *pTab;
  Trigger *pTrigger;
  Vdbe *p;
  WhereInfo *pWInfo;
  char *pcVar8;
  Parse *pPVar9;
  uint p2_00;
  Op *pOVar10;
  int iVar11;
  Schema **ppSVar12;
  uint uVar13;
  Index *pIVar14;
  Expr *pLimit_00;
  int in_R9D;
  u8 *aToOpen;
  ulong uVar15;
  VTable *zP4;
  long in_FS_OFFSET;
  bool bVar16;
  Index *local_108;
  int local_ec;
  int local_c4;
  char *local_88;
  Parse *local_80;
  NameContext sNC;
  int iIdxCur;
  int iDataCur;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  aToOpen = (u8 *)0x0;
  iDataCur = 0;
  iIdxCur = 0;
  sNC.pWinSelect = (Select *)&DAT_aaaaaaaaaaaaaaaa;
  sNC._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sNC._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sNC.uNC.pEList = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
  sNC.pNext = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
  sNC.pParse = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  sNC.pSrcList = (SrcList *)&DAT_aaaaaaaaaaaaaaaa;
  db = pParse->db;
  if (pParse->nErr != 0) goto LAB_0016a5e8;
  pTab = sqlite3SrcListLookup(pParse,pTabList);
  if (pTab != (Table *)0x0) {
    pTrigger = sqlite3TriggersExist(pParse,pTab,0x81,(ExprList *)0x0,(int *)0x0);
    uVar1 = pTab->eTabType;
    bVar16 = true;
    uVar4 = uVar1;
    if (pTrigger == (Trigger *)0x0) {
      iVar5 = sqlite3FkRequired((Parse *)pParse->db->flags,pTab,(int *)0x0,0);
      bVar16 = iVar5 != 0;
      uVar4 = pTab->eTabType;
    }
    if ((((uVar4 != '\x01') && (0 < pTab->nCol)) ||
        (iVar5 = viewGetColumnNames(pParse,pTab), iVar5 == 0)) &&
       (iVar5 = sqlite3IsReadOnly(pParse,pTab,pTrigger), iVar5 == 0)) {
      if (pTab->pSchema == (Schema *)0x0) {
        iVar5 = -0x8000;
      }
      else {
        iVar5 = -1;
        ppSVar12 = &db->aDb->pSchema;
        do {
          iVar5 = iVar5 + 1;
          pSVar2 = *ppSVar12;
          ppSVar12 = ppSVar12 + 4;
        } while (pSVar2 != pTab->pSchema);
      }
      pLimit_00 = (Expr *)db->aDb[iVar5].zDbSName;
      uVar13 = 0;
      iVar6 = sqlite3AuthCheck(pParse,9,pTab->zName,(char *)0x0,(char *)pLimit_00);
      aToOpen = (u8 *)0x0;
      if (iVar6 == 1) goto LAB_0016a5e8;
      p1 = pParse->nTab;
      iVar11 = p1 + 1;
      pParse->nTab = iVar11;
      pTabList->a[0].iCursor = p1;
      pIVar14 = pTab->pIndex;
      if (pIVar14 != (Index *)0x0) {
        uVar13 = 0;
        do {
          uVar13 = uVar13 + 1;
          pIVar14 = pIVar14->pNext;
        } while (pIVar14 != (Index *)0x0);
        pParse->nTab = iVar11 + uVar13;
      }
      if (uVar1 == '\x02') {
        local_88 = pParse->zAuthContext;
        pParse->zAuthContext = pTab->zName;
        local_80 = pParse;
      }
      else {
        local_88 = (char *)0x0;
        local_80 = (Parse *)0x0;
      }
      p = sqlite3GetVdbe(pParse);
      if (p == (Vdbe *)0x0) {
LAB_0016a7dd:
        aToOpen = (u8 *)0x0;
      }
      else {
        if (pParse->nested == '\0') {
          p->field_0xc8 = p->field_0xc8 | 0x10;
        }
        sqlite3BeginWriteOperation(pParse,(uint)bVar16,iVar5);
        if (uVar1 == '\x02') {
          sqlite3MaterializeView(pParse,pTab,pWhere,(ExprList *)(ulong)p1,pLimit_00,in_R9D);
          iIdxCur = p1;
          iDataCur = p1;
        }
        sNC.nRef = 0;
        sNC.nNcErr = 0;
        sNC.ncFlags = 0;
        sNC.nNestedSelect = 0;
        sNC.uNC.pEList = (ExprList *)0x0;
        sNC.pNext = (NameContext *)0x0;
        sNC.pWinSelect = (Select *)0x0;
        sNC.pParse = pParse;
        sNC.pSrcList = pTabList;
        iVar7 = sqlite3ResolveExprNames(&sNC,pWhere);
        p2_00 = 0;
        if (iVar7 != 0) goto LAB_0016a7dd;
        if ((((db->flags & 0x100000000) != 0) && (pParse->nested == '\0')) &&
           ((pParse->pTriggerTab == (Table *)0x0 && (p2_00 = 0, pParse->bReturning == '\0')))) {
          p2_00 = pParse->nMem + 1;
          pParse->nMem = p2_00;
          sqlite3VdbeAddOp3(p,0x47,0,p2_00,0);
        }
        if (((pWhere == (Expr *)0x0) && (iVar6 == 0)) &&
           ((bVar16 == false && (pTab->eTabType != '\x01')))) {
          sqlite3TableLock(pParse,iVar5,pTab->tnum,'\x01',pTab->zName);
          if ((pTab->tabFlags & 0x80) == 0) {
            pcVar8 = pTab->zName;
            iVar6 = sqlite3VdbeAddOp3(p,0x91,pTab->tnum,iVar5,-(uint)(p2_00 == 0) | p2_00);
            sqlite3VdbeChangeP4(p,iVar6,pcVar8,-1);
          }
          pIVar14 = pTab->pIndex;
          aToOpen = (u8 *)0x0;
          if (pIVar14 != (Index *)0x0) {
            do {
              if (((*(ushort *)&pIVar14->field_0x63 & 3) != 2) ||
                 (uVar13 = -(uint)(p2_00 == 0) | p2_00, (pTab->tabFlags & 0x80) == 0)) {
                uVar13 = 0;
              }
              sqlite3VdbeAddOp3(p,0x91,pIVar14->tnum,iVar5,uVar13);
              pIVar14 = pIVar14->pNext;
            } while (pIVar14 != (Index *)0x0);
          }
LAB_0016b18b:
          if (((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) &&
             (pParse->pAinc != (AutoincInfo *)0x0)) {
            autoIncrementEnd(pParse);
          }
          if (p2_00 != 0) {
            sqlite3CodeChangeCount(p,p2_00,"rows deleted");
          }
        }
        else {
          uVar15 = sNC._40_8_ & 0x40;
          if ((pTab->tabFlags & 0x80) == 0) {
            iVar5 = pParse->nMem + 1;
            pParse->nMem = iVar5;
            local_108 = (Index *)0x0;
            sqlite3VdbeAddOp3(p,0x4b,0,iVar5,0);
            nPk = 1;
            local_ec = 0;
            iVar6 = 0;
            local_c4 = 0;
          }
          else {
            iVar5 = 0;
            for (local_108 = pTab->pIndex; local_108 != (Index *)0x0; local_108 = local_108->pNext)
            {
              if ((*(ushort *)&local_108->field_0x63 & 3) == 2) goto LAB_0016a93f;
            }
            local_108 = (Index *)0x0;
LAB_0016a93f:
            nPk = local_108->nKeyCol;
            iVar6 = pParse->nTab;
            local_ec = pParse->nMem + 1;
            pParse->nMem = pParse->nMem + (int)(short)nPk;
            pParse->nTab = iVar6 + 1;
            local_c4 = sqlite3VdbeAddOp3(p,0x75,iVar6,(int)(short)nPk,0);
            sqlite3VdbeSetP4KeyInfo(pParse,local_108);
          }
          aToOpen = (u8 *)0x0;
          pWInfo = sqlite3WhereBegin(pParse,pTabList,pWhere,(ExprList *)0x0,(ExprList *)0x0,
                                     (Select *)0x0,(ushort)(uVar15 == 0 & (bVar16 ^ 1U)) * 8 + 0x14,
                                     iVar11);
          if (pWInfo != (WhereInfo *)0x0) {
            lVar3 = *(long *)pWInfo->aiCurOnePass;
            uVar4 = pWInfo->eOnePass;
            if (uVar4 != '\x01') {
              pPVar9 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar9 = pParse;
              }
              pPVar9->isMultiWrite = '\x01';
            }
            if ((pWInfo->field_0x44 & 1) != 0) {
              sqlite3VdbeAddOp3(p,0x8f,p1,0,0);
            }
            if (p2_00 != 0) {
              sqlite3VdbeAddOp3(p,0x56,p2_00,1,0);
            }
            iVar11 = (int)((ulong)lVar3 >> 0x20);
            if (local_108 == (Index *)0x0) {
              local_ec = pParse->nMem + 1;
              pParse->nMem = local_ec;
              sqlite3VdbeAddOp3(p,0x87,p1,local_ec,0);
              if (uVar4 != '\0') goto LAB_0016ac09;
              sqlite3VdbeAddOp3(p,0x9c,iVar5,local_ec,0);
              nPk = 1;
LAB_0016adf8:
              sqlite3WhereEnd(pWInfo);
              if (uVar1 != '\x02') {
                sqlite3OpenTableAndIndices(pParse,pTab,0x71,'\b',p1,(u8 *)0x0,&iDataCur,&iIdxCur);
              }
              if (local_108 == (Index *)0x0) {
                iVar7 = sqlite3VdbeAddOp3(p,0x2e,iVar5,0,local_ec);
LAB_0016aeb1:
                aToOpen = (u8 *)0x0;
                bVar16 = true;
                iVar5 = 0;
              }
              else {
                iVar5 = 0;
                iVar7 = sqlite3VdbeAddOp3(p,0x24,iVar6,0,0);
                if (pTab->eTabType == '\x01') {
                  sqlite3VdbeAddOp3(p,0x5e,iVar6,0,local_ec);
                  goto LAB_0016aeb1;
                }
                sqlite3VdbeAddOp3(p,0x86,iVar6,local_ec,0);
                bVar16 = true;
                aToOpen = (u8 *)0x0;
              }
LAB_0016afb4:
              if (pTab->eTabType == '\x01') goto LAB_0016afc8;
              sqlite3GenerateRowDelete
                        (pParse,pTab,pTrigger,iDataCur,iIdxCur,local_ec,nPk,pParse->nested == '\0',
                         '\v',uVar4,iVar11);
            }
            else {
              p2 = (uint)(short)nPk;
              if (0 < (short)nPk) {
                uVar15 = 0;
                do {
                  sqlite3ExprCodeGetColumnOfTable
                            (p,pTab,p1,(int)local_108->aiColumn[uVar15],local_ec + (int)uVar15);
                  uVar15 = uVar15 + 1;
                } while (p2 != uVar15);
              }
              if (uVar4 == '\0') {
                iVar7 = pParse->nMem + 1;
                pParse->nMem = iVar7;
                pcVar8 = local_108->zColAff;
                if (pcVar8 == (char *)0x0) {
                  pcVar8 = computeIndexAffStr(pParse->db,local_108);
                }
                addr = sqlite3VdbeAddOp3(p,0x61,local_ec,p2,iVar7);
                sqlite3VdbeChangeP4(p,addr,pcVar8,p2);
                sqlite3VdbeAddOp4Int(p,0x8a,iVar6,iVar7,local_ec,p2);
                nPk = 0;
                local_ec = iVar7;
                goto LAB_0016adf8;
              }
LAB_0016ac09:
              aToOpen = (u8 *)sqlite3DbMallocRawNN(db,(ulong)(uVar13 + 2));
              if (aToOpen == (u8 *)0x0) {
                sqlite3WhereEnd(pWInfo);
                goto LAB_0016a7dd;
              }
              memset(aToOpen,1,(ulong)uVar13 + 1);
              aToOpen[(ulong)uVar13 + 1] = '\0';
              if (-1 < (int)lVar3) {
                aToOpen[(int)((int)lVar3 - p1)] = '\0';
              }
              if (-1 < lVar3) {
                aToOpen[(int)(iVar11 - p1)] = '\0';
              }
              if (local_c4 != 0) {
                sqlite3VdbeChangeToNoop(p,local_c4);
              }
              iVar5 = pParse->nLabel + -1;
              pParse->nLabel = iVar5;
              if (uVar1 != '\x02') {
                if (uVar4 == '\x02') {
                  iVar7 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
                  sqlite3OpenTableAndIndices(pParse,pTab,0x71,'\b',p1,aToOpen,&iDataCur,&iIdxCur);
                  if (p->nOp + -1 == iVar7) {
                    p->nOp = iVar7;
                  }
                  else {
                    if (p->db->mallocFailed == '\0') {
                      pOVar10 = p->aOp + iVar7;
                    }
                    else {
                      pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
                    }
                    pOVar10->p2 = p->nOp;
                  }
                }
                else {
                  sqlite3OpenTableAndIndices(pParse,pTab,0x71,'\b',p1,aToOpen,&iDataCur,&iIdxCur);
                }
              }
              iVar7 = 0;
              if (pTab->eTabType != '\x01') {
                if (aToOpen[(int)(iDataCur - p1)] == '\0') {
                  bVar16 = false;
                  iVar7 = 0;
                }
                else {
                  sqlite3VdbeAddOp4Int(p,0x1c,iDataCur,iVar5,local_ec,(int)(short)nPk);
                  bVar16 = false;
                  iVar7 = 0;
                }
                goto LAB_0016afb4;
              }
              bVar16 = false;
LAB_0016afc8:
              for (zP4 = (pTab->u).vtab.p; zP4 != (VTable *)0x0; zP4 = zP4->pNext) {
                if (zP4->db == db) goto LAB_0016afeb;
              }
              zP4 = (VTable *)0x0;
LAB_0016afeb:
              sqlite3VtabMakeWritable(pParse,pTab);
              pPVar9 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar9 = pParse;
              }
              pPVar9->mayAbort = '\x01';
              if ((uVar4 == '\x01') &&
                 (sqlite3VdbeAddOp3(p,0x7a,p1,0,0), pParse->pToplevel == (Parse *)0x0)) {
                pParse->isMultiWrite = '\0';
              }
              iVar11 = sqlite3VdbeAddOp3(p,7,0,1,local_ec);
              sqlite3VdbeChangeP4(p,iVar11,(char *)zP4,-0xb);
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = 2;
              }
            }
            if (bVar16) {
              if (local_108 == (Index *)0x0) {
                iVar11 = 9;
                iVar6 = 0;
                iVar5 = iVar7;
              }
              else {
                iVar11 = 0x27;
                iVar5 = iVar7 + 1;
              }
              sqlite3VdbeAddOp3(p,iVar11,iVar6,iVar5,0);
              if (p->db->mallocFailed == '\0') {
                pOVar10 = p->aOp + iVar7;
              }
              else {
                pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              pOVar10->p2 = p->nOp;
            }
            else {
              sqlite3VdbeResolveLabel(p,iVar5);
              sqlite3WhereEnd(pWInfo);
            }
            goto LAB_0016b18b;
          }
        }
      }
      if (local_80 != (Parse *)0x0) {
        local_80->zAuthContext = local_88;
      }
      goto LAB_0016a5e8;
    }
  }
  aToOpen = (u8 *)0x0;
LAB_0016a5e8:
  sqlite3SrcListDelete(db,pTabList);
  if (pWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pWhere);
  }
  if (aToOpen != (u8 *)0x0) {
    sqlite3DbNNFreeNN(db,aToOpen);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteFrom(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table from which we should delete things */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  ExprList *pOrderBy,    /* ORDER BY clause. May be null */
  Expr *pLimit           /* LIMIT clause. May be null */
){
  Vdbe *v;               /* The virtual database engine */
  Table *pTab;           /* The table from which records will be deleted */
  int i;                 /* Loop counter */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Index *pIdx;           /* For looping over indices of the table */
  int iTabCur;           /* Cursor number for the table */
  int iDataCur = 0;      /* VDBE cursor for the canonical data source */
  int iIdxCur = 0;       /* Cursor number of the first index */
  int nIdx;              /* Number of indices */
  sqlite3 *db;           /* Main database structure */
  AuthContext sContext;  /* Authorization context */
  NameContext sNC;       /* Name context to resolve expressions in */
  int iDb;               /* Database number */
  int memCnt = 0;        /* Memory cell used for change counting */
  int rcauth;            /* Value returned by authorization callback */
  int eOnePass;          /* ONEPASS_OFF or _SINGLE or _MULTI */
  int aiCurOnePass[2];   /* The write cursors opened by WHERE_ONEPASS */
  u8 *aToOpen = 0;       /* Open cursor iTabCur+j if aToOpen[j] is true */
  Index *pPk;            /* The PRIMARY KEY index on the table */
  int iPk = 0;           /* First of nPk registers holding PRIMARY KEY value */
  i16 nPk = 1;           /* Number of columns in the PRIMARY KEY */
  int iKey;              /* Memory cell holding key of row to be deleted */
  i16 nKey;              /* Number of memory cells in the row key */
  int iEphCur = 0;       /* Ephemeral table holding all primary key values */
  int iRowSet = 0;       /* Register for rowset of rows to delete */
  int addrBypass = 0;    /* Address of jump over the delete logic */
  int addrLoop = 0;      /* Top of the delete loop */
  int addrEphOpen = 0;   /* Instruction to open the Ephemeral table */
  int bComplex;          /* True if there are triggers or FKs or
                         ** subqueries in the WHERE clause */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                  /* True if attempting to delete from a view */
  Trigger *pTrigger;           /* List of table triggers, if required */
#endif

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  assert( db->pParse==pParse );
  if( pParse->nErr ){
    goto delete_from_cleanup;
  }
  assert( db->mallocFailed==0 );
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to delete.  This table has to be
  ** put in an SrcList structure because some of the subroutines we
  ** will be calling are designed to work with multiple tables and expect
  ** an SrcList* parameter instead of just a Table* parameter.
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 )  goto delete_from_cleanup;

  /* Figure out if we have any triggers and if the table being
  ** deleted from is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
  isView = IsView(pTab);
#else
# define pTrigger 0
# define isView 0
#endif
  bComplex = pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0);
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x10000 ){
    sqlite3TreeViewLine(0, "In sqlite3Delete() at %s:%d", __FILE__, __LINE__);
    sqlite3TreeViewDelete(pParse->pWith, pTabList, pWhere,
                          pOrderBy, pLimit, pTrigger);
  }
#endif

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( !isView ){
    pWhere = sqlite3LimitWhere(
        pParse, pTabList, pWhere, pOrderBy, pLimit, "DELETE"
    );
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* If pTab is really a view, make sure it has been initialized.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto delete_from_cleanup;
  }

  if( sqlite3IsReadOnly(pParse, pTab, pTrigger) ){
    goto delete_from_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  rcauth = sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0,
                            db->aDb[iDb].zDbSName);
  assert( rcauth==SQLITE_OK || rcauth==SQLITE_DENY || rcauth==SQLITE_IGNORE );
  if( rcauth==SQLITE_DENY ){
    goto delete_from_cleanup;
  }
  assert(!isView || pTrigger);

  /* Assign cursor numbers to the table and all its indices.
  */
  assert( pTabList->nSrc==1 );
  iTabCur = pTabList->a[0].iCursor = pParse->nTab++;
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){
    pParse->nTab++;
  }

  /* Start the view context
  */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* Begin generating code.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto delete_from_cleanup;
  }
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, bComplex, iDb);

  /* If we are trying to delete from a view, realize that view into
  ** an ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab,
        pWhere, pOrderBy, pLimit, iTabCur
    );
    iDataCur = iIdxCur = iTabCur;
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* Resolve the column names in the WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto delete_from_cleanup;
  }

  /* Initialize the counter of the number of rows deleted, if
  ** we are counting rows.
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
   && !pParse->bReturning
  ){
    memCnt = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, memCnt);
  }

#ifndef SQLITE_OMIT_TRUNCATE_OPTIMIZATION
  /* Special case: A DELETE without a WHERE clause deletes everything.
  ** It is easier just to erase the whole table. Prior to version 3.6.5,
  ** this optimization caused the row change count (the value returned by
  ** API function sqlite3_count_changes) to be set incorrectly.
  **
  ** The "rcauth==SQLITE_OK" terms is the
  ** IMPLEMENTATION-OF: R-17228-37124 If the action code is SQLITE_DELETE and
  ** the callback returns SQLITE_IGNORE then the DELETE operation proceeds but
  ** the truncate optimization is disabled and all rows are deleted
  ** individually.
  */
  if( rcauth==SQLITE_OK
   && pWhere==0
   && !bComplex
   && !IsVirtual(pTab)
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
   && db->xPreUpdateCallback==0
#endif
  ){
    assert( !isView );
    sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp4(v, OP_Clear, pTab->tnum, iDb, memCnt ? memCnt : -1,
                        pTab->zName, P4_STATIC);
    }
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->pSchema==pTab->pSchema );
      if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Clear, pIdx->tnum, iDb, memCnt ? memCnt : -1);
      }else{
        sqlite3VdbeAddOp2(v, OP_Clear, pIdx->tnum, iDb);
      }
    }
  }else
#endif /* SQLITE_OMIT_TRUNCATE_OPTIMIZATION */
  {
    u16 wcf = WHERE_ONEPASS_DESIRED|WHERE_DUPLICATES_OK;
    if( sNC.ncFlags & NC_Subquery ) bComplex = 1;
    wcf |= (bComplex ? 0 : WHERE_ONEPASS_MULTIROW);
    if( HasRowid(pTab) ){
      /* For a rowid table, initialize the RowSet to an empty set */
      pPk = 0;
      assert( nPk==1 );
      iRowSet = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, iRowSet);
    }else{
      /* For a WITHOUT ROWID table, create an ephemeral table used to
      ** hold all primary keys for rows to be deleted. */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      nPk = pPk->nKeyCol;
      iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      iEphCur = pParse->nTab++;
      addrEphOpen = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, iEphCur, nPk);
      sqlite3VdbeSetP4KeyInfo(pParse, pPk);
    }

    /* Construct a query to find the rowid or primary key for every row
    ** to be deleted, based on the WHERE clause. Set variable eOnePass
    ** to indicate the strategy used to implement this delete:
    **
    **  ONEPASS_OFF:    Two-pass approach - use a FIFO for rowids/PK values.
    **  ONEPASS_SINGLE: One-pass approach - at most one row deleted.
    **  ONEPASS_MULTI:  One-pass approach - any number of rows may be deleted.
    */
    pWInfo = sqlite3WhereBegin(pParse, pTabList, pWhere, 0, 0,0,wcf,iTabCur+1);
    if( pWInfo==0 ) goto delete_from_cleanup;
    eOnePass = sqlite3WhereOkOnePass(pWInfo, aiCurOnePass);
    assert( IsVirtual(pTab)==0 || eOnePass!=ONEPASS_MULTI );
    assert( IsVirtual(pTab) || bComplex || eOnePass!=ONEPASS_OFF
            || OptimizationDisabled(db, SQLITE_OnePass) );
    if( eOnePass!=ONEPASS_SINGLE ) sqlite3MultiWrite(pParse);
    if( sqlite3WhereUsesDeferredSeek(pWInfo) ){
      sqlite3VdbeAddOp1(v, OP_FinishSeek, iTabCur);
    }

    /* Keep track of the number of rows to be deleted */
    if( memCnt ){
      sqlite3VdbeAddOp2(v, OP_AddImm, memCnt, 1);
    }

    /* Extract the rowid or primary key for the current row */
    if( pPk ){
      for(i=0; i<nPk; i++){
        assert( pPk->aiColumn[i]>=0 );
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur,
                                        pPk->aiColumn[i], iPk+i);
      }
      iKey = iPk;
    }else{
      iKey = ++pParse->nMem;
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, -1, iKey);
    }

    if( eOnePass!=ONEPASS_OFF ){
      /* For ONEPASS, no need to store the rowid/primary-key. There is only
      ** one, so just keep it in its register(s) and fall through to the
      ** delete code.  */
      nKey = nPk; /* OP_Found will use an unpacked key */
      aToOpen = sqlite3DbMallocRawNN(db, nIdx+2);
      if( aToOpen==0 ){
        sqlite3WhereEnd(pWInfo);
        goto delete_from_cleanup;
      }
      memset(aToOpen, 1, nIdx+1);
      aToOpen[nIdx+1] = 0;
      if( aiCurOnePass[0]>=0 ) aToOpen[aiCurOnePass[0]-iTabCur] = 0;
      if( aiCurOnePass[1]>=0 ) aToOpen[aiCurOnePass[1]-iTabCur] = 0;
      if( addrEphOpen ) sqlite3VdbeChangeToNoop(v, addrEphOpen);
      addrBypass = sqlite3VdbeMakeLabel(pParse);
    }else{
      if( pPk ){
        /* Add the PK key for this row to the temporary table */
        iKey = ++pParse->nMem;
        nKey = 0;   /* Zero tells OP_Found to use a composite key */
        sqlite3VdbeAddOp4(v, OP_MakeRecord, iPk, nPk, iKey,
            sqlite3IndexAffinityStr(pParse->db, pPk), nPk);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iEphCur, iKey, iPk, nPk);
      }else{
        /* Add the rowid of the row to be deleted to the RowSet */
        nKey = 1;  /* OP_DeferredSeek always uses a single rowid */
        sqlite3VdbeAddOp2(v, OP_RowSetAdd, iRowSet, iKey);
      }
      sqlite3WhereEnd(pWInfo);
    }

    /* Unless this is a view, open cursors for the table we are
    ** deleting from and all its indices. If this is a view, then the
    ** only effect this statement has is to fire the INSTEAD OF
    ** triggers.
    */
    if( !isView ){
      int iAddrOnce = 0;
      if( eOnePass==ONEPASS_MULTI ){
        iAddrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      }
      testcase( IsVirtual(pTab) );
      sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, OPFLAG_FORDELETE,
                                 iTabCur, aToOpen, &iDataCur, &iIdxCur);
      assert( pPk || IsVirtual(pTab) || iDataCur==iTabCur );
      assert( pPk || IsVirtual(pTab) || iIdxCur==iDataCur+1 );
      if( eOnePass==ONEPASS_MULTI ){
        sqlite3VdbeJumpHereOrPopInst(v, iAddrOnce);
      }
    }

    /* Set up a loop over the rowids/primary-keys that were found in the
    ** where-clause loop above.
    */
    if( eOnePass!=ONEPASS_OFF ){
      assert( nKey==nPk );  /* OP_Found will use an unpacked key */
      if( !IsVirtual(pTab) && aToOpen[iDataCur-iTabCur] ){
        assert( pPk!=0 || IsView(pTab) );
        sqlite3VdbeAddOp4Int(v, OP_NotFound, iDataCur, addrBypass, iKey, nKey);
        VdbeCoverage(v);
      }
    }else if( pPk ){
      addrLoop = sqlite3VdbeAddOp1(v, OP_Rewind, iEphCur); VdbeCoverage(v);
      if( IsVirtual(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iEphCur, 0, iKey);
      }else{
        sqlite3VdbeAddOp2(v, OP_RowData, iEphCur, iKey);
      }
      assert( nKey==0 );  /* OP_Found will use a composite key */
    }else{
      addrLoop = sqlite3VdbeAddOp3(v, OP_RowSetRead, iRowSet, 0, iKey);
      VdbeCoverage(v);
      assert( nKey==1 );
    }

    /* Delete the row */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );
      sqlite3MayAbort(pParse);
      if( eOnePass==ONEPASS_SINGLE ){
        sqlite3VdbeAddOp1(v, OP_Close, iTabCur);
        if( sqlite3IsToplevel(pParse) ){
          pParse->isMultiWrite = 0;
        }
      }
      sqlite3VdbeAddOp4(v, OP_VUpdate, 0, 1, iKey, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, OE_Abort);
    }else
#endif
    {
      int count = (pParse->nested==0);    /* True to count changes */
      sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
          iKey, nKey, count, OE_Default, eOnePass, aiCurOnePass[1]);
    }

    /* End of the loop over all rowids/primary-keys. */
    if( eOnePass!=ONEPASS_OFF ){
      sqlite3VdbeResolveLabel(v, addrBypass);
      sqlite3WhereEnd(pWInfo);
    }else if( pPk ){
      sqlite3VdbeAddOp2(v, OP_Next, iEphCur, addrLoop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, addrLoop);
    }else{
      sqlite3VdbeGoto(v, addrLoop);
      sqlite3VdbeJumpHere(v, addrLoop);
    }
  } /* End non-truncate path */

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /* Return the number of rows that were deleted. If this routine is
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( memCnt ){
    sqlite3CodeChangeCount(v, memCnt, "rows deleted");
  }

delete_from_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprDelete(db, pWhere);
#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
  sqlite3ExprListDelete(db, pOrderBy);
  sqlite3ExprDelete(db, pLimit);
#endif
  if( aToOpen ) sqlite3DbNNFreeNN(db, aToOpen);
  return;
}